

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

type __thiscall
duckdb::Deserializer::
Read<duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>,duckdb::ColumnDataCollection>
          (Deserializer *this)

{
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> __p;
  int iVar1;
  Deserializer *in_RSI;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> local_20;
  
  this->_vptr_Deserializer = (_func_int **)0x0;
  iVar1 = (*in_RSI->_vptr_Deserializer[10])();
  if ((char)iVar1 != '\0') {
    (*in_RSI->_vptr_Deserializer[6])();
    ColumnDataCollection::Deserialize((ColumnDataCollection *)&stack0xffffffffffffffe0,in_RSI);
    __p._M_head_impl = local_20._M_head_impl;
    local_20._M_head_impl = (ColumnDataCollection *)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
    ::reset((__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
             *)this,__p._M_head_impl);
    ::std::
    unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>::
    ~unique_ptr((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                 *)&stack0xffffffffffffffe0);
    (*in_RSI->_vptr_Deserializer[7])();
  }
  (*in_RSI->_vptr_Deserializer[0xb])();
  return (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
          )(unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
            )this;
}

Assistant:

inline typename std::enable_if<is_unique_ptr<T>::value && has_deserialize<ELEMENT_TYPE>::value, T>::type Read() {
		unique_ptr<ELEMENT_TYPE> ptr = nullptr;
		auto is_present = OnNullableBegin();
		if (is_present) {
			OnObjectBegin();
			ptr = ELEMENT_TYPE::Deserialize(*this);
			OnObjectEnd();
		}
		OnNullableEnd();
		return ptr;
	}